

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O1

void EmitDebugLineInternal
               (raw_ostream *RealOS,Data *DI,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *computedLengths)

{
  bool bVar1;
  uint32_t uVar2;
  pointer pLVar3;
  pointer puVar4;
  pointer pSVar5;
  pointer pFVar6;
  pointer pLVar7;
  iterator __position;
  uint uVar8;
  pointer pHVar9;
  pointer pHVar10;
  uint uVar11;
  byte bVar12;
  size_t sVar13;
  char *pcVar14;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *pvVar15;
  void *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *pcVar16;
  pointer puVar17;
  pointer pSVar18;
  pointer pFVar19;
  uint64_t uVar20;
  pointer pHVar21;
  ulong uVar22;
  pointer pHVar23;
  pointer pLVar24;
  undefined8 *puVar25;
  pointer pLVar26;
  pointer pLVar27;
  byte bVar28;
  size_type *local_128;
  string Buffer;
  size_t Size;
  uint64_t local_f8;
  uint64_t uStack_f0;
  ulong local_e8;
  File local_e0;
  vector<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_> local_b8;
  vector<llvm::yaml::Hex64,_std::allocator<llvm::yaml::Hex64>_> local_a0;
  pointer local_80;
  raw_ostream *local_78;
  undefined1 local_70 [8];
  raw_string_ostream OS;
  uint local_34;
  
  bVar28 = 0;
  pLVar27 = (DI->DebugLines).
            super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pLVar3 = (DI->DebugLines).
           super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pLVar27 != pLVar3) {
    local_78 = RealOS;
    OS.OS = (string *)DI;
    do {
      local_128 = &Buffer._M_string_length;
      Buffer._M_dataplus._M_p = (pointer)0x0;
      Buffer._M_string_length._0_1_ = 0;
      OS.super_raw_ostream.OutBufCur._0_4_ = 1;
      OS.super_raw_ostream.OutBufEnd = (char *)0x0;
      OS.super_raw_ostream._vptr_raw_ostream = (_func_int **)0x0;
      OS.super_raw_ostream.OutBufStart = (char *)0x0;
      local_70 = (undefined1  [8])&PTR__raw_string_ostream_010994b8;
      OS.super_raw_ostream._32_8_ = &local_128;
      uVar11 = *(uint *)&pLVar27->Version;
      uVar2 = (pLVar27->Length).TotalLength;
      uVar8 = CONCAT22((short)(uVar11 >> 0x10),(ushort)uVar11 << 8 | (ushort)uVar11 >> 8);
      if (*(char *)&((OS.OS)->_M_dataplus)._M_p != '\0') {
        uVar8 = uVar11;
      }
      Buffer.field_2._8_2_ = (short)uVar8;
      llvm::raw_ostream::write((raw_ostream *)local_70,(int)&Buffer + 0x18,(void *)0x2,(ulong)uVar8)
      ;
      bVar1 = *(bool *)&((OS.OS)->_M_dataplus)._M_p;
      sVar13 = (size_t)bVar1;
      writeVariableSizedInteger
                (pLVar27->PrologueLength,(ulong)(uVar2 == 0xffffffff) * 4 + 4,
                 (raw_ostream *)local_70,bVar1);
      Buffer.field_2._M_local_buf[8] = pLVar27->MinInstLength;
      llvm::raw_ostream::write((raw_ostream *)local_70,(int)&Buffer + 0x18,(void *)0x1,sVar13);
      if (3 < pLVar27->Version) {
        Buffer.field_2._M_local_buf[8] = pLVar27->MaxOpsPerInst;
        llvm::raw_ostream::write((raw_ostream *)local_70,(int)&Buffer + 0x18,(void *)0x1,sVar13);
      }
      Buffer.field_2._M_local_buf[8] = pLVar27->DefaultIsStmt;
      llvm::raw_ostream::write((raw_ostream *)local_70,(int)&Buffer + 0x18,(void *)0x1,sVar13);
      Buffer.field_2._M_local_buf[8] = pLVar27->LineBase;
      llvm::raw_ostream::write((raw_ostream *)local_70,(int)&Buffer + 0x18,(void *)0x1,sVar13);
      Buffer.field_2._M_local_buf[8] = pLVar27->LineRange;
      llvm::raw_ostream::write((raw_ostream *)local_70,(int)&Buffer + 0x18,(void *)0x1,sVar13);
      Buffer.field_2._M_local_buf[8] = pLVar27->OpcodeBase;
      llvm::raw_ostream::write((raw_ostream *)local_70,(int)&Buffer + 0x18,(void *)0x1,sVar13);
      puVar4 = (pLVar27->StandardOpcodeLengths).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pvVar15 = extraout_RDX;
      for (puVar17 = (pLVar27->StandardOpcodeLengths).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start; puVar17 != puVar4; puVar17 = puVar17 + 1) {
        Buffer.field_2._M_local_buf[8] = *puVar17;
        llvm::raw_ostream::write((raw_ostream *)local_70,(int)&Buffer + 0x18,(void *)0x1,sVar13);
        pvVar15 = extraout_RDX_00;
      }
      pSVar5 = (pLVar27->IncludeDirs).
               super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pSVar18 = (pLVar27->IncludeDirs).
                     super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
                     super__Vector_impl_data._M_start; pSVar18 != pSVar5; pSVar18 = pSVar18 + 1) {
        llvm::raw_ostream::write
                  ((raw_ostream *)local_70,(int)pSVar18->Data,(void *)pSVar18->Length,sVar13);
        llvm::raw_ostream::write((raw_ostream *)local_70,0,__buf,sVar13);
        pvVar15 = extraout_RDX_01;
      }
      llvm::raw_ostream::write((raw_ostream *)local_70,0,pvVar15,sVar13);
      pFVar6 = (pLVar27->Files).
               super__Vector_base<llvm::DWARFYAML::File,_std::allocator<llvm::DWARFYAML::File>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pvVar15 = extraout_RDX_02;
      for (pFVar19 = (pLVar27->Files).
                     super__Vector_base<llvm::DWARFYAML::File,_std::allocator<llvm::DWARFYAML::File>_>
                     ._M_impl.super__Vector_impl_data._M_start; pFVar19 != pFVar6;
          pFVar19 = pFVar19 + 1) {
        local_e8 = pFVar19->Length;
        Buffer.field_2._8_8_ = (pFVar19->Name).Data;
        Size = (pFVar19->Name).Length;
        local_f8 = pFVar19->DirIdx;
        uStack_f0 = pFVar19->ModTime;
        EmitFileEntry((raw_ostream *)local_70,(File *)((long)&Buffer.field_2 + 8));
        pvVar15 = extraout_RDX_03;
      }
      llvm::raw_ostream::write((raw_ostream *)local_70,0,pvVar15,sVar13);
      pLVar7 = (pLVar27->Opcodes).
               super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pLVar26 = (pLVar27->Opcodes).
                super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
                ._M_impl.super__Vector_impl_data._M_start;
      for (; local_80 = pLVar27, pLVar26 != pLVar7; pLVar26 = pLVar26 + 1) {
        pLVar24 = pLVar26;
        puVar25 = (undefined8 *)((long)&Buffer.field_2 + 8);
        for (sVar13 = 10; sVar13 != 0; sVar13 = sVar13 - 1) {
          *puVar25 = *(undefined8 *)pLVar24;
          pLVar24 = (pointer)((long)pLVar24 + (ulong)bVar28 * -0x10 + 8);
          puVar25 = puVar25 + (ulong)bVar28 * -2 + 1;
        }
        std::vector<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>::vector
                  (&local_b8,&pLVar26->UnknownOpcodeData);
        std::vector<llvm::yaml::Hex64,_std::allocator<llvm::yaml::Hex64>_>::vector
                  (&local_a0,&pLVar26->StandardOpcodeData);
        local_34 = CONCAT31(local_34._1_3_,Buffer.field_2._M_local_buf[8]);
        llvm::raw_ostream::write((raw_ostream *)local_70,(int)&local_34,(void *)0x1,sVar13);
        pHVar10 = local_a0.super__Vector_base<llvm::yaml::Hex64,_std::allocator<llvm::yaml::Hex64>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pcVar16 = extraout_RDX_04;
        uVar22 = Size;
        if (Buffer.field_2._M_local_buf[8] == '\0') {
          do {
            uVar11 = (uint)(byte)((byte)uVar22 | 0x80);
            if (uVar22 < 0x80) {
              uVar11 = (uint)uVar22;
            }
            pcVar14 = OS.super_raw_ostream.OutBufEnd;
            if (OS.super_raw_ostream.OutBufEnd < OS.super_raw_ostream.OutBufStart) {
              pcVar16 = OS.super_raw_ostream.OutBufEnd + 1;
              *OS.super_raw_ostream.OutBufEnd = (char)uVar11;
              OS.super_raw_ostream.OutBufEnd = pcVar16;
            }
            else {
              llvm::raw_ostream::write
                        ((raw_ostream *)local_70,uVar11 & 0xff,pcVar16,
                         (size_t)OS.super_raw_ostream.OutBufEnd);
              pcVar16 = extraout_RDX_06;
            }
            bVar1 = 0x7f < uVar22;
            uVar22 = uVar22 >> 7;
          } while (bVar1);
          local_34 = CONCAT31(local_34._1_3_,(undefined1)local_f8);
          llvm::raw_ostream::write
                    ((raw_ostream *)local_70,(int)&local_34,(void *)0x1,(size_t)pcVar14);
          pHVar9 = local_b8.super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          pHVar21 = local_b8.super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          switch((undefined4)local_f8) {
          case 1:
            break;
          case 2:
          case 4:
            writeVariableSizedInteger
                      (uStack_f0,(ulong)(byte)OS.OS[0xb]._M_dataplus._M_p[0x18],
                       (raw_ostream *)local_70,*(bool *)&((OS.OS)->_M_dataplus)._M_p);
            break;
          case 3:
            EmitFileEntry((raw_ostream *)local_70,&local_e0);
            break;
          default:
            for (; pHVar21 != pHVar9; pHVar21 = pHVar21 + 1) {
              local_34 = CONCAT31(local_34._1_3_,pHVar21->value);
              llvm::raw_ostream::write
                        ((raw_ostream *)local_70,(int)&local_34,(void *)0x1,(size_t)pcVar14);
            }
          }
        }
        else if ((byte)Buffer.field_2._M_local_buf[8] < local_80->OpcodeBase) {
          pHVar23 = local_a0.
                    super__Vector_base<llvm::yaml::Hex64,_std::allocator<llvm::yaml::Hex64>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          switch(Buffer.field_2._M_local_buf[8]) {
          case '\x01':
          case '\x06':
          case '\a':
          case '\b':
          case '\n':
          case '\v':
            break;
          case '\x02':
          case '\x04':
          case '\x05':
          case '\f':
            uVar20 = uStack_f0;
            do {
              uVar11 = (uint)(byte)((byte)uVar20 | 0x80);
              if (uVar20 < 0x80) {
                uVar11 = (uint)uVar20;
              }
              if (OS.super_raw_ostream.OutBufEnd < OS.super_raw_ostream.OutBufStart) {
                pcVar16 = OS.super_raw_ostream.OutBufEnd + 1;
                *OS.super_raw_ostream.OutBufEnd = (char)uVar11;
                OS.super_raw_ostream.OutBufEnd = pcVar16;
              }
              else {
                llvm::raw_ostream::write
                          ((raw_ostream *)local_70,uVar11 & 0xff,pcVar16,
                           (size_t)OS.super_raw_ostream.OutBufEnd);
                pcVar16 = extraout_RDX_05;
              }
              bVar1 = 0x7f < uVar20;
              uVar20 = uVar20 >> 7;
            } while (bVar1);
            break;
          case '\x03':
            uVar22 = local_e8;
            do {
              if (uVar22 < 0x40) {
                pLVar27 = (pointer)0x0;
              }
              else {
                pLVar27 = (pointer)CONCAT71((int7)((ulong)pLVar27 >> 8),
                                            (uVar22 & 0x40) == 0 ||
                                            (long)uVar22 >> 7 != 0xffffffffffffffff);
              }
              bVar12 = (char)((ulong)pLVar27 & 0xffffffff) << 7 | (byte)uVar22 & 0x7f;
              if (OS.super_raw_ostream.OutBufEnd < OS.super_raw_ostream.OutBufStart) {
                pcVar16 = OS.super_raw_ostream.OutBufEnd + 1;
                *OS.super_raw_ostream.OutBufEnd = bVar12;
                OS.super_raw_ostream.OutBufEnd = pcVar16;
              }
              else {
                llvm::raw_ostream::write
                          ((raw_ostream *)local_70,(uint)bVar12,pcVar16,
                           CONCAT71((int7)(((ulong)pLVar27 & 0xffffffff) >> 8),bVar12));
                pcVar16 = extraout_RDX_07;
              }
              uVar22 = (long)uVar22 >> 7;
            } while ((char)pLVar27 != '\0');
            break;
          case '\t':
            uVar11 = CONCAT22((short)(uStack_f0 >> 0x10),
                              (ushort)uStack_f0 << 8 | (ushort)uStack_f0 >> 8);
            if (*(char *)&((OS.OS)->_M_dataplus)._M_p != '\0') {
              uVar11 = (uint)uStack_f0;
            }
            local_34 = CONCAT22(local_34._2_2_,(short)uVar11);
            llvm::raw_ostream::write
                      ((raw_ostream *)local_70,(int)&local_34,(void *)0x2,(ulong)uVar11);
            break;
          default:
            for (; pHVar23 != pHVar10; pHVar23 = pHVar23 + 1) {
              uVar22 = pHVar23->value;
              do {
                uVar11 = (uint)(byte)((byte)uVar22 | 0x80);
                if (uVar22 < 0x80) {
                  uVar11 = (uint)uVar22;
                }
                if (OS.super_raw_ostream.OutBufEnd < OS.super_raw_ostream.OutBufStart) {
                  pcVar16 = OS.super_raw_ostream.OutBufEnd + 1;
                  *OS.super_raw_ostream.OutBufEnd = (char)uVar11;
                  OS.super_raw_ostream.OutBufEnd = pcVar16;
                }
                else {
                  llvm::raw_ostream::write
                            ((raw_ostream *)local_70,uVar11 & 0xff,pcVar16,
                             (size_t)OS.super_raw_ostream.OutBufEnd);
                  pcVar16 = extraout_RDX_08;
                }
                bVar1 = 0x7f < uVar22;
                uVar22 = uVar22 >> 7;
              } while (bVar1);
            }
          }
        }
        if (local_a0.super__Vector_base<llvm::yaml::Hex64,_std::allocator<llvm::yaml::Hex64>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a0.
                          super__Vector_base<llvm::yaml::Hex64,_std::allocator<llvm::yaml::Hex64>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_a0.
                                super__Vector_base<llvm::yaml::Hex64,_std::allocator<llvm::yaml::Hex64>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_a0.
                                super__Vector_base<llvm::yaml::Hex64,_std::allocator<llvm::yaml::Hex64>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_b8.super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8.
                          super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_b8.
                                super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_b8.
                                super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        pLVar27 = local_80;
      }
      if ((_func_int **)OS.super_raw_ostream.OutBufEnd != OS.super_raw_ostream._vptr_raw_ostream) {
        llvm::raw_ostream::flush_nonempty((raw_ostream *)local_70);
      }
      Buffer.field_2._8_8_ = *(ulong *)(OS.super_raw_ostream._32_8_ + 8);
      if (0xfffffffe < (ulong)Buffer.field_2._8_8_) {
        llvm::llvm_unreachable_internal
                  ("Table is too big",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFEmitter.cpp"
                   ,0x166);
      }
      if (computedLengths != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
        __position._M_current =
             (computedLengths->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (computedLengths->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)computedLengths,
                     __position,(unsigned_long *)(Buffer.field_2._M_local_buf + 8));
        }
        else {
          *__position._M_current = Buffer.field_2._8_8_;
          (computedLengths->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
          _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      local_34 = (uint)Buffer.field_2._8_4_ >> 0x18 | (Buffer.field_2._8_4_ & 0xff0000) >> 8 |
                 (Buffer.field_2._8_4_ & 0xff00) << 8 | Buffer.field_2._8_4_ << 0x18;
      if (*(char *)&((OS.OS)->_M_dataplus)._M_p != '\0') {
        local_34 = Buffer.field_2._8_4_;
      }
      sVar13 = (size_t)local_34;
      llvm::raw_ostream::write(local_78,(int)&local_34,(void *)0x4,sVar13);
      if ((_func_int **)OS.super_raw_ostream.OutBufEnd != OS.super_raw_ostream._vptr_raw_ostream) {
        llvm::raw_ostream::flush_nonempty((raw_ostream *)local_70);
      }
      llvm::raw_ostream::write
                (local_78,(int)*(undefined8 *)OS.super_raw_ostream._32_8_,
                 *(void **)(OS.super_raw_ostream._32_8_ + 8),sVar13);
      llvm::raw_string_ostream::~raw_string_ostream((raw_string_ostream *)local_70);
      if (local_128 != &Buffer._M_string_length) {
        operator_delete(local_128,
                        CONCAT71(Buffer._M_string_length._1_7_,(undefined1)Buffer._M_string_length)
                        + 1);
      }
      pLVar27 = pLVar27 + 1;
    } while (pLVar27 != pLVar3);
  }
  return;
}

Assistant:

static void EmitDebugLineInternal(raw_ostream &RealOS,
                                  const DWARFYAML::Data &DI,
                                  std::vector<size_t>* computedLengths) {
  for (auto &LineTable : DI.DebugLines) {
    // XXX BINARYEN We need to update each line table's length. Write to a
    // temp stream first, then get the size from that.
    std::string Buffer;
    raw_string_ostream OS(Buffer);

    // XXX BINARYEN writeInitialLength(LineTable.Length, OS, DI.IsLittleEndian);

    uint64_t SizeOfPrologueLength = LineTable.Length.isDWARF64() ? 8 : 4;
    writeInteger((uint16_t)LineTable.Version, OS, DI.IsLittleEndian);
    writeVariableSizedInteger(LineTable.PrologueLength, SizeOfPrologueLength,
                              OS, DI.IsLittleEndian);
    writeInteger((uint8_t)LineTable.MinInstLength, OS, DI.IsLittleEndian);
    if (LineTable.Version >= 4)
      writeInteger((uint8_t)LineTable.MaxOpsPerInst, OS, DI.IsLittleEndian);
    writeInteger((uint8_t)LineTable.DefaultIsStmt, OS, DI.IsLittleEndian);
    writeInteger((uint8_t)LineTable.LineBase, OS, DI.IsLittleEndian);
    writeInteger((uint8_t)LineTable.LineRange, OS, DI.IsLittleEndian);
    writeInteger((uint8_t)LineTable.OpcodeBase, OS, DI.IsLittleEndian);

    for (auto OpcodeLength : LineTable.StandardOpcodeLengths)
      writeInteger((uint8_t)OpcodeLength, OS, DI.IsLittleEndian);

    for (auto IncludeDir : LineTable.IncludeDirs) {
      OS.write(IncludeDir.data(), IncludeDir.size());
      OS.write('\0');
    }
    OS.write('\0');

    for (auto File : LineTable.Files)
      EmitFileEntry(OS, File);
    OS.write('\0');

    for (auto Op : LineTable.Opcodes) {
      writeInteger((uint8_t)Op.Opcode, OS, DI.IsLittleEndian);
      if (Op.Opcode == 0) {
        encodeULEB128(Op.ExtLen, OS);
        writeInteger((uint8_t)Op.SubOpcode, OS, DI.IsLittleEndian);
        switch (Op.SubOpcode) {
        case dwarf::DW_LNE_set_address:
        case dwarf::DW_LNE_set_discriminator:
          writeVariableSizedInteger(Op.Data, DI.CompileUnits[0].AddrSize, OS,
                                    DI.IsLittleEndian);
          break;
        case dwarf::DW_LNE_define_file:
          EmitFileEntry(OS, Op.FileEntry);
          break;
        case dwarf::DW_LNE_end_sequence:
          break;
        default:
          for (auto OpByte : Op.UnknownOpcodeData)
            writeInteger((uint8_t)OpByte, OS, DI.IsLittleEndian);
        }
      } else if (Op.Opcode < LineTable.OpcodeBase) {
        switch (Op.Opcode) {
        case dwarf::DW_LNS_copy:
        case dwarf::DW_LNS_negate_stmt:
        case dwarf::DW_LNS_set_basic_block:
        case dwarf::DW_LNS_const_add_pc:
        case dwarf::DW_LNS_set_prologue_end:
        case dwarf::DW_LNS_set_epilogue_begin:
          break;

        case dwarf::DW_LNS_advance_pc:
        case dwarf::DW_LNS_set_file:
        case dwarf::DW_LNS_set_column:
        case dwarf::DW_LNS_set_isa:
          encodeULEB128(Op.Data, OS);
          break;

        case dwarf::DW_LNS_advance_line:
          encodeSLEB128(Op.SData, OS);
          break;

        case dwarf::DW_LNS_fixed_advance_pc:
          writeInteger((uint16_t)Op.Data, OS, DI.IsLittleEndian);
          break;

        default:
          for (auto OpData : Op.StandardOpcodeData) {
            encodeULEB128(OpData, OS);
          }
        }
      }
    }
    // XXX BINARYEN Write to the actual stream, with the proper size.
    // We assume for now that the length fits in 32 bits.
    size_t Size = OS.str().size();
    if (Size >= UINT32_MAX) {
      llvm_unreachable("Table is too big");
    }
    if (computedLengths) {
      computedLengths->push_back(Size);
    }
    writeInteger((uint32_t)Size, RealOS, DI.IsLittleEndian);
    RealOS << OS.str();
  }
}